

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O0

void mg_printf_html_escape(mg_connection *nc,char *fmt,...)

{
  char in_AL;
  undefined8 in_RCX;
  undefined8 in_RDX;
  char *buf_00;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_168 [16];
  undefined8 local_158;
  undefined8 local_150;
  undefined8 local_148;
  undefined8 local_140;
  undefined8 local_138;
  undefined8 local_128;
  undefined8 local_118;
  undefined8 local_108;
  undefined8 local_f8;
  undefined8 local_e8;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined1 local_b8 [8];
  va_list ap;
  int local_98;
  int len;
  int j;
  int i;
  char *buf;
  char mem [100];
  char *fmt_local;
  mg_connection *nc_local;
  
  if (in_AL != '\0') {
    local_138 = in_XMM0_Qa;
    local_128 = in_XMM1_Qa;
    local_118 = in_XMM2_Qa;
    local_108 = in_XMM3_Qa;
    local_f8 = in_XMM4_Qa;
    local_e8 = in_XMM5_Qa;
    local_d8 = in_XMM6_Qa;
    local_c8 = in_XMM7_Qa;
  }
  _j = &buf;
  ap[0].overflow_arg_area = local_168;
  ap[0]._0_8_ = &stack0x00000008;
  local_b8._4_4_ = 0x30;
  local_b8._0_4_ = 0x10;
  local_158 = in_RDX;
  local_150 = in_RCX;
  local_148 = in_R8;
  local_140 = in_R9;
  ap[0].reg_save_area._4_4_ = mg_avprintf((char **)&j,100,fmt,(__va_list_tag *)local_b8);
  if (-1 < ap[0].reg_save_area._4_4_) {
    local_98 = 0;
    for (len = 0; len < ap[0].reg_save_area._4_4_; len = len + 1) {
      if ((*(char *)((long)_j + (long)len) == '<') || (*(char *)((long)_j + (long)len) == '>')) {
        mg_send(nc,(void *)((long)_j + (long)local_98),len - local_98);
        buf_00 = "&gt;";
        if (*(char *)((long)_j + (long)len) == '<') {
          buf_00 = "&lt;";
        }
        mg_send(nc,buf_00,4);
        local_98 = len + 1;
      }
    }
    mg_send(nc,(void *)((long)_j + (long)local_98),len - local_98);
  }
  if ((_j != &buf) && (_j != (char **)0x0)) {
    free(_j);
  }
  return;
}

Assistant:

void mg_printf_html_escape(struct mg_connection *nc, const char *fmt, ...) {
    char mem[MG_VPRINTF_BUFFER_SIZE], *buf = mem;
    int i, j, len;
    va_list ap;

    va_start(ap, fmt);
    len = mg_avprintf(&buf, sizeof(mem), fmt, ap);
    va_end(ap);

    if (len >= 0) {
        for (i = j = 0; i < len; i++) {
            if (buf[i] == '<' || buf[i] == '>') {
                mg_send(nc, buf + j, i - j);
                mg_send(nc, buf[i] == '<' ? "&lt;" : "&gt;", 4);
                j = i + 1;
            }
        }
        mg_send(nc, buf + j, i - j);
    }

    /* LCOV_EXCL_START */
    if (buf != mem && buf != NULL) {
        MG_FREE(buf);
    }
    /* LCOV_EXCL_STOP */
}